

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_timeout.c
# Opt level: O1

void ares_timeval_diff(ares_timeval_t *tvdiff,ares_timeval_t *tvstart,ares_timeval_t *tvstop)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = tvstop->sec - tvstart->sec;
  tvdiff->sec = lVar3;
  uVar2 = tvstop->usec;
  uVar1 = tvstart->usec;
  if (uVar2 <= uVar1) {
    tvdiff->sec = lVar3 + -1;
    uVar2 = uVar2 + 1000000;
  }
  tvdiff->usec = uVar2 - uVar1;
  return;
}

Assistant:

void ares_timeval_diff(ares_timeval_t *tvdiff, const ares_timeval_t *tvstart,
                       const ares_timeval_t *tvstop)
{
  tvdiff->sec = tvstop->sec - tvstart->sec;
  if (tvstop->usec > tvstart->usec) {
    tvdiff->usec = tvstop->usec - tvstart->usec;
  } else {
    tvdiff->sec  -= 1;
    tvdiff->usec  = tvstop->usec + 1000000 - tvstart->usec;
  }
}